

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O1

uint64_t uv_get_constrained_memory(void)

{
  int iVar1;
  uint64_t rc;
  char buf [32];
  char filename [256];
  uint64_t local_130;
  char local_128 [32];
  char local_108 [256];
  
  local_130 = 0;
  snprintf(local_108,0x100,"/sys/fs/cgroup/%s/%s","memory","memory.limit_in_bytes");
  iVar1 = uv__slurp(local_108,local_128,0x20);
  if (iVar1 == 0) {
    sscanf(local_128,"%lu",&local_130);
  }
  return local_130;
}

Assistant:

static uint64_t uv__read_cgroups_uint64(const char* cgroup, const char* param) {
  char filename[256];
  char buf[32];  /* Large enough to hold an encoded uint64_t. */
  uint64_t rc;

  rc = 0;
  snprintf(filename, sizeof(filename), "/sys/fs/cgroup/%s/%s", cgroup, param);
  if (0 == uv__slurp(filename, buf, sizeof(buf)))
    sscanf(buf, "%" PRIu64, &rc);

  return rc;
}